

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall FfsParser::parseFileBody(FfsParser *this,UModelIndex *index)

{
  TreeModel *pTVar1;
  bool bVar2;
  UINT8 UVar3;
  __type _Var4;
  USTATUS UVar5;
  UByteArray fileGuid;
  UByteArray local_38;
  
  bVar2 = UModelIndex::isValid(index);
  if (!bVar2) {
    return 1;
  }
  UVar3 = TreeModel::type(this->model,index);
  if (UVar3 != 'B') {
    return 0;
  }
  UVar3 = TreeModel::subtype(this->model,index);
  if (UVar3 == 0xf0) {
    UVar5 = parsePadFileBody(this,index);
    return UVar5;
  }
  UVar3 = TreeModel::subtype(this->model,index);
  if ((UVar3 != '\x01') && (UVar3 = TreeModel::subtype(this->model,index), UVar3 != '\0')) {
    TreeModel::body(&fileGuid,this->model,index);
    UVar5 = parseSections(this,&fileGuid,index,true);
    goto LAB_00118a96;
  }
  TreeModel::header(&local_38,this->model,index);
  UByteArray::UByteArray(&fileGuid,local_38.d._M_dataplus._M_p,0x10);
  std::__cxx11::string::~string((string *)&local_38);
  _Var4 = std::operator==(&fileGuid.d,&NVRAM_NVAR_STORE_FILE_GUID.d);
  if (_Var4) {
    pTVar1 = this->model;
    Bstrlib::CBString::CBString((CBString *)&local_38,"NVAR store");
    TreeModel::setText(pTVar1,index,(CBString *)&local_38);
LAB_00118a8a:
    Bstrlib::CBString::~CBString((CBString *)&local_38);
  }
  else {
    _Var4 = std::operator==(&fileGuid.d,&NVRAM_NVAR_PEI_EXTERNAL_DEFAULTS_FILE_GUID.d);
    if (_Var4) {
      pTVar1 = this->model;
      Bstrlib::CBString::CBString((CBString *)&local_38,"NVRAM external defaults");
      TreeModel::setText(pTVar1,index,(CBString *)&local_38);
      goto LAB_00118a8a;
    }
    _Var4 = std::operator==(&fileGuid.d,&NVRAM_NVAR_BB_DEFAULTS_FILE_GUID.d);
    if (_Var4) {
      pTVar1 = this->model;
      Bstrlib::CBString::CBString((CBString *)&local_38,"NVAR BB defaults");
      TreeModel::setText(pTVar1,index,(CBString *)&local_38);
      goto LAB_00118a8a;
    }
    _Var4 = std::operator==(&fileGuid.d,&PROTECTED_RANGE_VENDOR_HASH_FILE_GUID_PHOENIX.d);
    if (_Var4) {
      UVar5 = parseVendorHashFile(this,&fileGuid,index);
      goto LAB_00118a96;
    }
    _Var4 = std::operator==(&fileGuid.d,&AMI_ROM_HOLE_FILE_GUID_0.d);
    if (((((!_Var4) && (_Var4 = std::operator==(&fileGuid.d,&AMI_ROM_HOLE_FILE_GUID_1.d), !_Var4))
         && (_Var4 = std::operator==(&fileGuid.d,&AMI_ROM_HOLE_FILE_GUID_2.d), !_Var4)) &&
        (((_Var4 = std::operator==(&fileGuid.d,&AMI_ROM_HOLE_FILE_GUID_3.d), !_Var4 &&
          (_Var4 = std::operator==(&fileGuid.d,&AMI_ROM_HOLE_FILE_GUID_4.d), !_Var4)) &&
         ((_Var4 = std::operator==(&fileGuid.d,&AMI_ROM_HOLE_FILE_GUID_5.d), !_Var4 &&
          ((_Var4 = std::operator==(&fileGuid.d,&AMI_ROM_HOLE_FILE_GUID_6.d), !_Var4 &&
           (_Var4 = std::operator==(&fileGuid.d,&AMI_ROM_HOLE_FILE_GUID_7.d), !_Var4)))))))) &&
       ((_Var4 = std::operator==(&fileGuid.d,&AMI_ROM_HOLE_FILE_GUID_8.d), !_Var4 &&
        (((((_Var4 = std::operator==(&fileGuid.d,&AMI_ROM_HOLE_FILE_GUID_9.d), !_Var4 &&
            (_Var4 = std::operator==(&fileGuid.d,&AMI_ROM_HOLE_FILE_GUID_10.d), !_Var4)) &&
           (_Var4 = std::operator==(&fileGuid.d,&AMI_ROM_HOLE_FILE_GUID_11.d), !_Var4)) &&
          ((_Var4 = std::operator==(&fileGuid.d,&AMI_ROM_HOLE_FILE_GUID_12.d), !_Var4 &&
           (_Var4 = std::operator==(&fileGuid.d,&AMI_ROM_HOLE_FILE_GUID_13.d), !_Var4)))) &&
         ((_Var4 = std::operator==(&fileGuid.d,&AMI_ROM_HOLE_FILE_GUID_14.d), !_Var4 &&
          (_Var4 = std::operator==(&fileGuid.d,&AMI_ROM_HOLE_FILE_GUID_15.d), !_Var4)))))))) {
      UVar5 = parseRawArea(this,index);
      goto LAB_00118a96;
    }
    pTVar1 = this->model;
    Bstrlib::CBString::CBString((CBString *)&local_38,"AMI ROM hole");
    TreeModel::setText(pTVar1,index,(CBString *)&local_38);
    Bstrlib::CBString::~CBString((CBString *)&local_38);
    TreeModel::setFixed(this->model,index,true);
  }
  UVar5 = 0;
LAB_00118a96:
  std::__cxx11::string::~string((string *)&fileGuid);
  return UVar5;
}

Assistant:

USTATUS FfsParser::parseFileBody(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Do not parse non-file bodies
    if (model->type(index) != Types::File)
        return U_SUCCESS;
    
    // Parse padding file body
    if (model->subtype(index) == EFI_FV_FILETYPE_PAD)
        return parsePadFileBody(index);
    
    // Parse raw files as raw areas
    if (model->subtype(index) == EFI_FV_FILETYPE_RAW || model->subtype(index) == EFI_FV_FILETYPE_ALL) {
        UByteArray fileGuid = UByteArray(model->header(index).constData(), sizeof(EFI_GUID));
        
        // Parse NVAR store
        if (fileGuid == NVRAM_NVAR_STORE_FILE_GUID) {
            model->setText(index, UString("NVAR store"));
            return nvramParser->parseNvarStore(index);
        }
        else if (fileGuid == NVRAM_NVAR_PEI_EXTERNAL_DEFAULTS_FILE_GUID) {
            model->setText(index, UString("NVRAM external defaults"));
            return nvramParser->parseNvarStore(index);
        }
        else if (fileGuid == NVRAM_NVAR_BB_DEFAULTS_FILE_GUID) {
            model->setText(index, UString("NVAR BB defaults"));
            return nvramParser->parseNvarStore(index);
        }
        // Parse vendor hash file
        else if (fileGuid == PROTECTED_RANGE_VENDOR_HASH_FILE_GUID_PHOENIX) {
            return parseVendorHashFile(fileGuid, index);
        }
        // Parse AMI ROM hole
        else if (fileGuid == AMI_ROM_HOLE_FILE_GUID_0
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_1
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_2
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_3
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_4
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_5
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_6
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_7
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_8
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_9
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_10
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_11
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_12
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_13
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_14
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_15) {
            model->setText(index, UString("AMI ROM hole"));
            // Mark ROM hole file as Fixed in the image
            model->setFixed(index, Fixed);
            // No need to parse further
            return U_SUCCESS;
        }
        
        return parseRawArea(index);
    }
    
    // Parse sections
    return parseSections(model->body(index), index, true);
}